

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1_hash.cpp
# Opt level: O0

void __thiscall libtorrent::digest32<256L>::stream_out(digest32<256L> *this,ostream *os)

{
  difference_type in_RCX;
  span<const_char> in;
  aux *local_48;
  char *local_40;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  digest32<256L> *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  span<char_const>::span<libtorrent::digest32<256l>,char,void>((span<char_const> *)&local_48,this);
  in.m_len = in_RCX;
  in.m_ptr = local_40;
  libtorrent::aux::to_hex_abi_cxx11_(&local_38,local_48,in);
  ::std::operator<<(os,(string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void digest32<N>::stream_out(std::ostream& os) const
	{
		os << aux::to_hex(*this);
	}